

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_test.cpp
# Opt level: O2

void flatbuffers::tests::EvolutionTest(string *tests_data_path)

{
  bool bVar1;
  uint8_t expval;
  Union UVar2;
  Union expval_00;
  Enum expval_01;
  int32_t expval_02;
  long lVar3;
  uint8_t *puVar4;
  TableC *pTVar5;
  TableA *this;
  undefined4 extraout_var;
  Struct *pSVar6;
  undefined4 extraout_var_00;
  Struct *pSVar7;
  undefined1 *puVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int iVar9;
  Root *this_00;
  Root *this_01;
  string *buf;
  void *pvVar10;
  string *buf_00;
  ulong __n;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  string local_c48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  string json;
  string local_bb0;
  string schema;
  undefined8 auStack_b58 [2];
  string jsonfiles [2];
  string schemas [2];
  IDLOptions idl_opts;
  Parser parser;
  
  lVar3 = 0x10;
  do {
    puVar8 = (undefined1 *)((long)&schemas[0]._M_dataplus._M_p + lVar3);
    *(undefined1 **)((long)&jsonfiles[1].field_2 + lVar3) = puVar8;
    *(undefined8 *)((long)&jsonfiles[1].field_2 + lVar3 + 8) = 0;
    *puVar8 = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x50);
  lVar3 = 0x10;
  do {
    puVar8 = (undefined1 *)((long)&jsonfiles[0]._M_dataplus._M_p + lVar3);
    *(undefined1 **)((long)auStack_b58 + lVar3) = puVar8;
    *(undefined8 *)((long)auStack_b58 + lVar3 + 8) = 0;
    *puVar8 = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x50);
  binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  IDLOptions::IDLOptions(&idl_opts);
  idl_opts.lang_to_generate._1_1_ = idl_opts.lang_to_generate._1_1_ | 1;
  Parser::Parser(&parser,&idl_opts);
  __result.container = binaries;
  iVar9 = 1;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x20) {
    std::operator+(&local_bf0,tests_data_path,"evolution_test/evolution_v");
    NumToString<int>(&local_c48,iVar9);
    std::operator+(&json,&local_bf0,&local_c48);
    std::operator+(&schema,&json,".fbs");
    std::__cxx11::string::~string((string *)&json);
    std::__cxx11::string::~string((string *)&local_c48);
    std::__cxx11::string::~string((string *)&local_bf0);
    buf = (string *)((long)&schemas[0]._M_dataplus._M_p + lVar3);
    bVar1 = LoadFile(schema._M_dataplus._M_p,false,buf);
    TestEq<bool,bool>(true,bVar1,
                      "\'true\' != \'flatbuffers::LoadFile(schema.c_str(), false, &schemas[i])\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x1b,"");
    std::operator+(&local_c48,tests_data_path,"evolution_test/evolution_v");
    NumToString<int>(&local_bb0,iVar9);
    std::operator+(&local_bf0,&local_c48,&local_bb0);
    std::operator+(&json,&local_bf0,".json");
    std::__cxx11::string::~string((string *)&local_bf0);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::~string((string *)&local_c48);
    buf_00 = (string *)((long)&jsonfiles[0]._M_dataplus._M_p + lVar3);
    bVar1 = LoadFile(json._M_dataplus._M_p,false,buf_00);
    TestEq<bool,bool>(true,bVar1,
                      "\'true\' != \'flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i])\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x1e,"");
    bVar1 = Parser::Parse(&parser,(buf->_M_dataplus)._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'parser.Parse(schemas[i].c_str())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x20,"");
    bVar1 = Parser::Parse(&parser,(buf_00->_M_dataplus)._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'parser.Parse(jsonfiles[i].c_str())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x21,"");
    __n = (ulong)parser.builder_.buf_.size_;
    puVar4 = FlatBufferBuilderImpl<false>::GetBufferPointer(&parser.builder_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(__result.container,__n);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (puVar4,puVar4 + __n,__result);
    std::__cxx11::string::~string((string *)&json);
    std::__cxx11::string::~string((string *)&schema);
    __result.container = __result.container + 1;
    iVar9 = iVar9 + 1;
  }
  for (lVar3 = 8; lVar3 != 0x38; lVar3 = lVar3 + 0x18) {
    puVar4 = *(uint8_t **)((long)binaries + lVar3 + -8);
    VerifierTemplate<false>::VerifierTemplate
              ((VerifierTemplate<false> *)&schema,puVar4,
               *(long *)((long)&binaries[0].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar3) - (long)puVar4,
               0x40,1000000,true);
    bVar1 = Evolution::V1::VerifyRootBuffer((VerifierTemplate<false> *)&schema);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'Evolution::V1::VerifyRootBuffer(verifier)\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x2d,"");
    bVar1 = Evolution::V2::VerifyRootBuffer((VerifierTemplate<false> *)&schema);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'Evolution::V2::VerifyRootBuffer(verifier)\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x2e,"");
  }
  if (binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    this_00 = (Root *)0x0;
  }
  else {
    this_00 = (Root *)(binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                      *(uint *)binaries[0].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  }
  pTVar5 = Evolution::V2::Root::k(this_00);
  TestEq<bool,bool>(true,pTVar5 == (TableC *)0x0,
                    "\'true\' != \'nullptr == root_v1_viewed_from_v2->k()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x34,"");
  expval = Evolution::V2::Root::l(this_00);
  pvVar10 = (void *)0x38;
  TestEq<unsigned_char,int>
            (expval,0x38,"\'root_v1_viewed_from_v2->l()\' != \'56\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
             ,0x36,"");
  this = Evolution::V2::Root::e(this_00);
  iVar9 = Evolution::V2::TableA::c(this,pvVar10,extraout_RDX);
  TestEq<bool,bool>(true,CONCAT44(extraout_var,iVar9) == 0,
                    "\'true\' != \'nullptr == root_v1_viewed_from_v2->e()->c()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x38,"");
  pTVar5 = Evolution::V2::Root::c_as_TableC(this_00);
  TestEq<bool,bool>(true,pTVar5 == (TableC *)0x0,
                    "\'true\' != \'nullptr == root_v1_viewed_from_v2->c_as_TableC()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x3a,"");
  UVar2 = Evolution::V2::Root::c_type(this_00);
  TestEq<bool,bool>(true,UVar2 == TableB,
                    "\'true\' != \'root_v1_viewed_from_v2->c_type() == Evolution::V2::Union::TableB\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x3c,"");
  pSVar6 = Evolution::V2::Root::ff(this_00);
  TestEq<int,int>(*(int *)pSVar6,0x10,"\'root_v1_viewed_from_v2->ff()->a()\' != \'16\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                  ,0x3f,"");
  if (binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    this_01 = (Root *)0x0;
  }
  else {
    this_01 = (Root *)(binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                      *(uint *)binaries[1].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  }
  expval_00 = Evolution::V1::Root::c_type(this_01);
  pvVar10 = (void *)0x3;
  TestEq<unsigned_char,int>
            (expval_00,3,"\'static_cast<uint8_t>(root_v2_viewed_from_v1->c_type())\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
             ,0x45,"");
  iVar9 = Evolution::V1::Root::c(this_01,pvVar10,extraout_RDX_00);
  TestEq<bool,bool>(true,CONCAT44(extraout_var_00,iVar9) != 0,
                    "\'nullptr\' == \'root_v2_viewed_from_v1->c()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x46,"");
  expval_01 = Evolution::V1::Root::d(this_01);
  TestEq<signed_char,int>
            (expval_01,3,"\'static_cast<int8_t>(root_v2_viewed_from_v1->d())\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
             ,0x49,"");
  expval_02 = Evolution::V1::Root::a(this_01);
  TestEq<int,int>(expval_02,0,"\'root_v2_viewed_from_v1->a()\' != \'0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                  ,0x4c,"");
  pSVar7 = Evolution::V1::Root::f(this_01);
  TestEq<int,int>(*(int *)pSVar7,0x23,"\'root_v2_viewed_from_v1->f()->a()\' != \'35\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                  ,0x4f,"");
  Parser::~Parser(&parser);
  IDLOptions::~IDLOptions(&idl_opts);
  lVar3 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&jsonfiles[0]._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&schemas[0]._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  return;
}

Assistant:

void EvolutionTest(const std::string &tests_data_path) {
  // VS10 does not support typed enums, exclude from tests
#if !defined(_MSC_VER) || _MSC_VER >= 1700
  const int NUM_VERSIONS = 2;
  std::string schemas[NUM_VERSIONS];
  std::string jsonfiles[NUM_VERSIONS];
  std::vector<uint8_t> binaries[NUM_VERSIONS];

  flatbuffers::IDLOptions idl_opts;
  idl_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
  flatbuffers::Parser parser(idl_opts);

  // Load all the schema versions and their associated data.
  for (int i = 0; i < NUM_VERSIONS; ++i) {
    std::string schema = tests_data_path + "evolution_test/evolution_v" +
                         flatbuffers::NumToString(i + 1) + ".fbs";
    TEST_ASSERT(flatbuffers::LoadFile(schema.c_str(), false, &schemas[i]));
    std::string json = tests_data_path + "evolution_test/evolution_v" +
                       flatbuffers::NumToString(i + 1) + ".json";
    TEST_ASSERT(flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i]));

    TEST_ASSERT(parser.Parse(schemas[i].c_str()));
    TEST_ASSERT(parser.Parse(jsonfiles[i].c_str()));

    auto bufLen = parser.builder_.GetSize();
    auto buf = parser.builder_.GetBufferPointer();
    binaries[i].reserve(bufLen);
    std::copy(buf, buf + bufLen, std::back_inserter(binaries[i]));
  }

  // Assert that all the verifiers for the different schema versions properly
  // verify any version data.
  for (int i = 0; i < NUM_VERSIONS; ++i) {
    flatbuffers::Verifier verifier(&binaries[i].front(), binaries[i].size());
    TEST_ASSERT(Evolution::V1::VerifyRootBuffer(verifier));
    TEST_ASSERT(Evolution::V2::VerifyRootBuffer(verifier));
  }

  // Test backwards compatibility by reading old data with an evolved schema.
  auto root_v1_viewed_from_v2 = Evolution::V2::GetRoot(&binaries[0].front());
  // field 'k' is new in version 2, so it should be null.
  TEST_ASSERT(nullptr == root_v1_viewed_from_v2->k());
  // field 'l' is new in version 2 with a default of 56.
  TEST_EQ(root_v1_viewed_from_v2->l(), 56);
  // field 'c' of 'TableA' is new in version 2, so it should be null.
  TEST_ASSERT(nullptr == root_v1_viewed_from_v2->e()->c());
  // 'TableC' was added to field 'c' union in version 2, so it should be null.
  TEST_ASSERT(nullptr == root_v1_viewed_from_v2->c_as_TableC());
  // The field 'c' union should be of type 'TableB' regardless of schema version
  TEST_ASSERT(root_v1_viewed_from_v2->c_type() == Evolution::V2::Union::TableB);
  // The field 'f' was renamed to 'ff' in version 2, it should still be
  // readable.
  TEST_EQ(root_v1_viewed_from_v2->ff()->a(), 16);

  // Test forwards compatibility by reading new data with an old schema.
  auto root_v2_viewed_from_v1 = Evolution::V1::GetRoot(&binaries[1].front());
  // The field 'c' union in version 2 is a new table (index = 3) and should
  // still be accessible, but not interpretable.
  TEST_EQ(static_cast<uint8_t>(root_v2_viewed_from_v1->c_type()), 3);
  TEST_NOTNULL(root_v2_viewed_from_v1->c());
  // The field 'd' enum in verison 2 has new members and should still be
  // accessible, but not interpretable.
  TEST_EQ(static_cast<int8_t>(root_v2_viewed_from_v1->d()), 3);
  // The field 'a' in version 2 is deprecated and should return the default
  // value (0) instead of the value stored in the in the buffer (42).
  TEST_EQ(root_v2_viewed_from_v1->a(), 0);
  // The field 'ff' was originally named 'f' in version 1, it should still be
  // readable.
  TEST_EQ(root_v2_viewed_from_v1->f()->a(), 35);
#endif
}